

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPListener.cpp
# Opt level: O1

void __thiscall hwnet::TCPListener::Do(TCPListener *this)

{
  mutex *__mutex;
  int iVar1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  char cVar5;
  lock_guard<std::mutex> guard;
  undefined1 auStack_f8 [8];
  Addr addr;
  undefined1 auStack_70 [8];
  sockaddr addr_;
  undefined4 local_58;
  undefined4 uStack_54;
  int local_3c;
  int local_38;
  socklen_t local_34;
  int fd_;
  socklen_t len;
  
  __mutex = &this->mtx;
  addr._112_8_ = &this->onNewConn_;
  do {
    uVar2 = (this->addr).addrType - 1;
    local_34 = 0;
    if (uVar2 < 3) {
      local_34 = *(socklen_t *)(&DAT_0011ccf8 + (ulong)uVar2 * 4);
    }
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar3 != 0) {
LAB_0011982c:
      std::__throw_system_error(iVar3);
    }
    iVar1 = this->readableVer;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    iVar3 = accept(this,(int)&local_38,(sockaddr *)auStack_70,&local_34);
    if (iVar3 == 0xb) {
      iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (iVar3 != 0) goto LAB_0011982c;
      iVar3 = this->readableVer;
      cVar5 = '\0';
      if (iVar1 == iVar3) {
        this->doing = false;
        cVar5 = '\x02';
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      if (iVar1 == iVar3) goto LAB_0011980e;
LAB_001197fd:
      cVar5 = ((this->stop)._M_base._M_i & 1U) * '\x02';
    }
    else {
      if (iVar3 == 0) {
        std::__shared_ptr<hwnet::TCPListener,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<hwnet::TCPListener,void>
                  ((__shared_ptr<hwnet::TCPListener,(__gnu_cxx::_Lock_policy)2> *)
                   (addr_.sa_data + 6),
                   (__weak_ptr<hwnet::TCPListener,_(__gnu_cxx::_Lock_policy)2> *)
                   &this->super_enable_shared_from_this<hwnet::TCPListener>);
        iVar3 = local_38;
        auStack_f8._0_2_ = 0;
        auStack_f8[2] = '\0';
        auStack_f8[3] = '\0';
        auStack_f8[4] = '\0';
        auStack_f8[5] = '\0';
        auStack_f8[6] = '\0';
        auStack_f8[7] = '\0';
        addr.sockaddr._0_4_ = 0;
        addr.sockaddr.in6.sin6_flowinfo = 0;
        addr.sockaddr._8_4_ = 0;
        addr.sockaddr._12_4_ = 0;
        addr.sockaddr._16_4_ = 0;
        addr.sockaddr._20_4_ = 0;
        addr.sockaddr._24_8_ = 0;
        addr.sockaddr._32_8_ = 0;
        addr.sockaddr._40_8_ = 0;
        addr.sockaddr._48_8_ = 0;
        addr.sockaddr._56_8_ = 0;
        addr.sockaddr._64_8_ = 0;
        addr.sockaddr._72_8_ = 0;
        addr.sockaddr._80_8_ = 0;
        addr.sockaddr._88_8_ = 0;
        addr.sockaddr._96_8_ = 0;
        if (local_34 == 0x6e) {
          addr.sockaddr._104_8_ = 0x100000003;
          memcpy(auStack_f8,auStack_70,0x6e);
        }
        else if (local_34 == 0x1c) {
          addr.sockaddr._104_8_ = 0xa00000002;
          auStack_f8 = auStack_70;
          addr.sockaddr._0_2_ = addr_.sa_family;
          addr.sockaddr._2_1_ = addr_.sa_data[0];
          addr.sockaddr._3_1_ = addr_.sa_data[1];
          addr.sockaddr.in.sin_addr.s_addr = (in_addr)(in_addr)addr_.sa_data._2_4_;
          addr.sockaddr._8_1_ = addr_.sa_data[6];
          addr.sockaddr._9_1_ = addr_.sa_data[7];
          addr.sockaddr._10_1_ = addr_.sa_data[8];
          addr.sockaddr._11_1_ = addr_.sa_data[9];
          addr.sockaddr._12_1_ = addr_.sa_data[10];
          addr.sockaddr._13_1_ = addr_.sa_data[0xb];
          addr.sockaddr._14_1_ = addr_.sa_data[0xc];
          addr.sockaddr._15_1_ = addr_.sa_data[0xd];
          addr.sockaddr._16_4_ = local_58;
        }
        else if (local_34 == 0x10) {
          addr.sockaddr._104_8_ = 0x200000001;
          auStack_f8 = auStack_70;
          addr.sockaddr._0_2_ = addr_.sa_family;
          addr.sockaddr._2_1_ = addr_.sa_data[0];
          addr.sockaddr._3_1_ = addr_.sa_data[1];
          addr.sockaddr.in.sin_addr.s_addr = (in_addr)(in_addr)addr_.sa_data._2_4_;
        }
        else {
          addr.sockaddr._104_8_ = 0;
        }
        local_3c = iVar3;
        if ((this->onNewConn_).super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
LAB_00119838:
          uVar4 = std::__throw_bad_function_call();
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              CONCAT44(addr.sockaddr.in6.sin6_flowinfo,addr.sockaddr._0_4_) !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       CONCAT44(addr.sockaddr.in6.sin6_flowinfo,addr.sockaddr._0_4_));
          }
          _Unwind_Resume(uVar4);
        }
        (*(this->onNewConn_)._M_invoker)
                  ((_Any_data *)addr._112_8_,(shared_ptr<hwnet::TCPListener> *)(addr_.sa_data + 6),
                   &local_3c,(Addr *)auStack_f8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_54,local_58) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_54,local_58));
        }
        goto LAB_001197fd;
      }
      if ((this->onError_).super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_001197fd;
      std::__shared_ptr<hwnet::TCPListener,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<hwnet::TCPListener,void>
                ((__shared_ptr<hwnet::TCPListener,(__gnu_cxx::_Lock_policy)2> *)auStack_f8,
                 (__weak_ptr<hwnet::TCPListener,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<hwnet::TCPListener>);
      addr_.sa_data._6_4_ = iVar3;
      if ((this->onError_).super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_00119838;
      (*(this->onError_)._M_invoker)
                ((_Any_data *)&this->onError_,(shared_ptr<hwnet::TCPListener> *)auStack_f8,
                 (int *)(addr_.sa_data + 6));
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          CONCAT44(addr.sockaddr.in6.sin6_flowinfo,addr.sockaddr._0_4_) !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT44(addr.sockaddr.in6.sin6_flowinfo,addr.sockaddr._0_4_));
      }
      cVar5 = '\x02';
    }
LAB_0011980e:
    if (cVar5 != '\0') {
      return;
    }
  } while( true );
}

Assistant:

void TCPListener::Do() {
	for(;;) {
		struct sockaddr addr_;
		socklen_t len = this->addr.AddrLen();
		int       fd_;
		this->mtx.lock();		
		auto localVer = this->readableVer;
		this->mtx.unlock();
		auto err = this->accept(&fd_,&addr_,&len);
		if(0 == err) {
			this->onNewConn_(shared_from_this(),fd_,Addr::MakeBySockAddr(&addr_,len));
		} else {
			if(err == EAGAIN) {
				std::lock_guard<std::mutex> guard(this->mtx);
				if(localVer == this->readableVer) {
					this->doing = false;
					break;
				}
			} else {
				if(nullptr != this->onError_){
					this->onError_(shared_from_this(),err);
					break;
				}
			}
		}
		if(this->stop.load() == true) {
			break;
		}
	}
}